

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

bool __thiscall QOpenGL2PaintEngineEx::begin(QOpenGL2PaintEngineEx *this,QPaintDevice *pdev)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  socklen_t __len;
  int iVar5;
  QOpenGL2PaintEngineExPrivate *pQVar6;
  QOpenGLContext *this_00;
  QOpenGLContext *pQVar7;
  long lVar8;
  QOpenGLContextPrivate *pQVar9;
  QOpenGLPaintDevicePrivate *pQVar10;
  QOpenGLEngineShaderManager *this_01;
  ulong uVar11;
  sockaddr *__addr;
  QOpenGLPaintDevice *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int i;
  bool created;
  bool needsVAO;
  QOpenGL2PaintEngineExPrivate *d;
  QSize sz;
  int in_stack_fffffffffffffef8;
  UsagePattern in_stack_fffffffffffffefc;
  QOpenGLPaintDevice *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0d;
  byte bVar12;
  byte bVar13;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  QMessageLogger *in_stack_ffffffffffffff10;
  bool local_e1;
  int local_cc;
  bool local_a1;
  QSurfaceFormat local_a0 [8];
  undefined1 local_98 [16];
  QRegion local_88 [8];
  QBrush local_80 [8];
  QRegion local_78 [8];
  QSize local_70;
  int local_68 [2];
  pair<int,_int> local_60;
  QSurfaceFormat local_58 [8];
  undefined8 local_50;
  QSurfaceFormat local_48 [8];
  QSurfaceFormat local_40 [8];
  QSurfaceFormat local_38 [8];
  undefined8 local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QOpenGL2PaintEngineEx *)0x1658b5);
  pQVar6->device = in_RSI;
  if (pQVar6->device == (QOpenGLPaintDevice *)0x0) {
    local_a1 = false;
  }
  else {
    (**(code **)(*(long *)pQVar6->device + 0x40))();
    this_00 = QOpenGLPaintDevice::context((QOpenGLPaintDevice *)0x165907);
    pQVar7 = (QOpenGLContext *)QOpenGLContext::currentContext();
    if ((this_00 == pQVar7) &&
       (pQVar7 = QOpenGLPaintDevice::context((QOpenGLPaintDevice *)0x16592f),
       pQVar7 != (QOpenGLContext *)0x0)) {
      local_30 = QOpenGLContext::currentContext();
      bVar2 = ::operator!=((QPointer<QOpenGLContext> *)in_stack_ffffffffffffff00,
                           (QOpenGLContext **)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar1 = false;
      bVar3 = false;
      local_e1 = true;
      if (!bVar2) {
        bVar2 = QPointer::operator_cast_to_bool((QPointer<QOpenGLContext> *)0x1659c6);
        in_stack_ffffffffffffff0f = false;
        local_e1 = (bool)in_stack_ffffffffffffff0f;
        if (bVar2) {
          lVar8 = QOpenGLContext::currentContext();
          in_stack_ffffffffffffff0f = false;
          local_e1 = (bool)in_stack_ffffffffffffff0f;
          if (lVar8 != 0) {
            QPointer<QOpenGLContext>::operator->((QPointer<QOpenGLContext> *)0x1659fa);
            QOpenGLContext::format();
            bVar1 = true;
            QOpenGLContext::currentContext();
            QOpenGLContext::format();
            bVar3 = true;
            in_stack_ffffffffffffff0f =
                 ::operator!=((QSurfaceFormat *)in_stack_ffffffffffffff00,
                              (QSurfaceFormat *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            local_e1 = (bool)in_stack_ffffffffffffff0f;
          }
        }
      }
      if (bVar3) {
        QSurfaceFormat::~QSurfaceFormat(local_40);
      }
      if (bVar1) {
        QSurfaceFormat::~QSurfaceFormat(local_38);
      }
      if ((local_e1 & 1U) != 0) {
        QOpenGLBuffer::destroy((QOpenGLBuffer *)in_stack_ffffffffffffff00);
        QOpenGLBuffer::destroy((QOpenGLBuffer *)in_stack_ffffffffffffff00);
        QOpenGLBuffer::destroy((QOpenGLBuffer *)in_stack_ffffffffffffff00);
        QOpenGLBuffer::destroy((QOpenGLBuffer *)in_stack_ffffffffffffff00);
        QOpenGLVertexArrayObject::destroy((QOpenGLVertexArrayObject *)in_stack_ffffffffffffff00);
      }
      QOpenGLContext::currentContext();
      QPointer<QOpenGLContext>::operator=
                ((QPointer<QOpenGLContext> *)in_stack_ffffffffffffff00,
                 (QOpenGLContext *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QPointer<QOpenGLContext>::operator->((QPointer<QOpenGLContext> *)0x165b07);
      pQVar9 = QOpenGLContext::d_func((QOpenGLContext *)0x165b0f);
      *(undefined8 *)(pQVar9 + 0x100) = in_RDI;
      pQVar10 = QOpenGLPaintDevicePrivate::get((QOpenGLPaintDevice *)0x165b2c);
      (*pQVar10->_vptr_QOpenGLPaintDevicePrivate[2])();
      QOpenGLFunctions::initializeOpenGLFunctions();
      pQVar7 = QPointer<QOpenGLContext>::operator->((QPointer<QOpenGLContext> *)0x165b57);
      iVar5 = (int)pQVar7;
      QOpenGLContext::format();
      __len = QSurfaceFormat::profile();
      bVar12 = 0;
      bVar13 = bVar12;
      if (__len == 1) {
        QPointer<QOpenGLContext>::operator->((QPointer<QOpenGLContext> *)0x165b9b);
        QOpenGLContext::format();
        local_50 = QSurfaceFormat::version();
        local_68[1] = 3;
        local_68[0] = 2;
        std::pair<int,_int>::pair<int,_int,_true>(&local_60,local_68 + 1,local_68);
        iVar5 = (int)&local_60;
        bVar12 = std::operator>=((pair<int,_int> *)in_stack_ffffffffffffff00,
                                 (pair<int,_int> *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        bVar13 = bVar12;
        QSurfaceFormat::~QSurfaceFormat(local_58);
      }
      QSurfaceFormat::~QSurfaceFormat(local_48);
      if ((((bVar12 & 1) != 0) &&
          (bVar3 = QOpenGLVertexArrayObject::isCreated
                             ((QOpenGLVertexArrayObject *)in_stack_ffffffffffffff00), !bVar3)) &&
         (bVar3 = QOpenGLVertexArrayObject::create
                            ((QOpenGLVertexArrayObject *)in_stack_ffffffffffffff00), bVar3)) {
        QOpenGLVertexArrayObject::bind(&pQVar6->vao,iVar5,__addr,__len);
      }
      bVar3 = QOpenGLBuffer::isCreated((QOpenGLBuffer *)in_stack_ffffffffffffff00);
      if (!bVar3) {
        QOpenGLBuffer::create((QOpenGLBuffer *)this_00);
        QOpenGLBuffer::setUsagePattern
                  ((QOpenGLBuffer *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      }
      bVar3 = QOpenGLBuffer::isCreated((QOpenGLBuffer *)in_stack_ffffffffffffff00);
      if (!bVar3) {
        QOpenGLBuffer::create((QOpenGLBuffer *)this_00);
        QOpenGLBuffer::setUsagePattern
                  ((QOpenGLBuffer *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      }
      bVar3 = QOpenGLBuffer::isCreated((QOpenGLBuffer *)in_stack_ffffffffffffff00);
      if (!bVar3) {
        QOpenGLBuffer::create((QOpenGLBuffer *)this_00);
        QOpenGLBuffer::setUsagePattern
                  ((QOpenGLBuffer *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      }
      bVar3 = QOpenGLBuffer::isCreated((QOpenGLBuffer *)in_stack_ffffffffffffff00);
      if (!bVar3) {
        QOpenGLBuffer::create((QOpenGLBuffer *)this_00);
        QOpenGLBuffer::setUsagePattern
                  ((QOpenGLBuffer *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      }
      for (local_cc = 0; local_cc < 3; local_cc = local_cc + 1) {
        pQVar6->vertexAttributeArraysEnabledState[local_cc] = false;
      }
      local_70.wd.m_i = -0x55555556;
      local_70.ht.m_i = -0x55555556;
      local_70 = QOpenGLPaintDevice::size(in_stack_ffffffffffffff00);
      iVar5 = QSize::width((QSize *)0x165de6);
      pQVar6->width = iVar5;
      iVar5 = QSize::height((QSize *)0x165e00);
      pQVar6->height = iVar5;
      pQVar6->mode = BrushDrawingMode;
      pQVar6->brushTextureDirty = true;
      pQVar6->brushUniformsDirty = true;
      pQVar6->matrixUniformDirty = true;
      pQVar6->matrixDirty = true;
      pQVar6->compositionModeDirty = true;
      pQVar6->opacityUniformDirty = true;
      pQVar6->needsSync = true;
      QPaintEngine::systemClip();
      bVar4 = QRegion::isEmpty();
      pQVar6->useSystemClip = (bool)((bVar4 ^ 0xff) & 1);
      QRegion::~QRegion(local_78);
      QBrush::QBrush(local_80);
      QBrush::operator=((QBrush *)in_stack_ffffffffffffff00,
                        (QBrush *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QBrush::~QBrush(local_80);
      QRect::QRect((QRect *)CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(local_e1,CONCAT15(bVar13,CONCAT14(bVar12,
                                                  in_stack_ffffffffffffff08)))),
                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
      QRegion::QRegion(local_88,local_98,0);
      QRegion::operator=((QRegion *)in_stack_ffffffffffffff00,
                         (QRegion *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QRegion::~QRegion(local_88);
      pQVar6->stencilClean = true;
      this_01 = (QOpenGLEngineShaderManager *)operator_new(0x98);
      QPointer::operator_cast_to_QOpenGLContext_((QPointer<QOpenGLContext> *)0x165f6d);
      QOpenGLEngineShaderManager::QOpenGLEngineShaderManager
                (this_01,(QOpenGLContext *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pQVar6->shaderManager = this_01;
      QOpenGLFunctions::glDisable((QOpenGLFunctions *)this_01,in_stack_fffffffffffffefc);
      QOpenGLFunctions::glDisable((QOpenGLFunctions *)this_01,in_stack_fffffffffffffefc);
      QOpenGLFunctions::glDisable((QOpenGLFunctions *)this_01,in_stack_fffffffffffffefc);
      pQVar6->glyphCacheFormat = Format_A8;
      QOpenGLContext::currentContext();
      uVar11 = QOpenGLContext::isOpenGLES();
      if ((uVar11 & 1) == 0) {
        QOpenGLFunctions::glDisable((QOpenGLFunctions *)this_01,in_stack_fffffffffffffefc);
        pQVar6->glyphCacheFormat = Format_A32;
        pQVar6->multisamplingAlwaysEnabled = false;
      }
      else {
        QOpenGLPaintDevice::context((QOpenGLPaintDevice *)0x166031);
        QOpenGLContext::format();
        iVar5 = QSurfaceFormat::samples();
        pQVar6->multisamplingAlwaysEnabled = 1 < iVar5;
        QSurfaceFormat::~QSurfaceFormat(local_a0);
      }
      local_a1 = true;
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff10,
                 (char *)CONCAT17(in_stack_ffffffffffffff0f,
                                  CONCAT16(in_stack_ffffffffffffff0e,
                                           CONCAT15(in_stack_ffffffffffffff0d,
                                                    CONCAT14(in_stack_ffffffffffffff0c,
                                                             in_stack_ffffffffffffff08)))),
                 (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QMessageLogger::warning
                (local_28,"QPainter::begin(): QOpenGLPaintDevice\'s context needs to be current");
      local_a1 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_a1;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGL2PaintEngineEx::begin(QPaintDevice *pdev)
{
    Q_D(QOpenGL2PaintEngineEx);

    Q_ASSERT(pdev->devType() == QInternal::OpenGL);
    d->device = static_cast<QOpenGLPaintDevice*>(pdev);

    if (!d->device)
        return false;

    d->device->ensureActiveTarget();

    if (d->device->context() != QOpenGLContext::currentContext() || !d->device->context()) {
        qWarning("QPainter::begin(): QOpenGLPaintDevice's context needs to be current");
        return false;
    }

    if (d->ctx != QOpenGLContext::currentContext()
            || (d->ctx && QOpenGLContext::currentContext() && d->ctx->format() != QOpenGLContext::currentContext()->format())) {
        d->vertexBuffer.destroy();
        d->texCoordBuffer.destroy();
        d->opacityBuffer.destroy();
        d->indexBuffer.destroy();
        d->vao.destroy();
    }

    d->ctx = QOpenGLContext::currentContext();
    d->ctx->d_func()->active_engine = this;

    QOpenGLPaintDevicePrivate::get(d->device)->beginPaint();

    d->funcs.initializeOpenGLFunctions();

    // Generate a new Vertex Array Object if we don't have one already.  We can
    // only hit the VAO-based path when using a core profile context.  This is
    // because while non-core contexts can support VAOs via extensions, legacy
    // components like the QtOpenGL module do not know about VAOs. There are
    // still tests for QGL-QOpenGL paint engine interoperability, so keep the
    // status quo for now, and avoid introducing a VAO in non-core contexts.
    const bool needsVAO = d->ctx->format().profile() == QSurfaceFormat::CoreProfile
        && d->ctx->format().version() >= std::pair(3, 2);
    if (needsVAO && !d->vao.isCreated()) {
        bool created = d->vao.create();

        // If we managed to create it then we have a profile that supports VAOs
        if (created)
            d->vao.bind();
    }

    // Generate a new Vertex Buffer Object if we don't have one already
    if (!d->vertexBuffer.isCreated()) {
        d->vertexBuffer.create();
        // Set its usage to StreamDraw, we will use this buffer only a few times before refilling it
        d->vertexBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->texCoordBuffer.isCreated()) {
        d->texCoordBuffer.create();
        d->texCoordBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->opacityBuffer.isCreated()) {
        d->opacityBuffer.create();
        d->opacityBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->indexBuffer.isCreated()) {
        d->indexBuffer.create();
        d->indexBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }

    for (int i = 0; i < QT_GL_VERTEX_ARRAY_TRACKED_COUNT; ++i)
        d->vertexAttributeArraysEnabledState[i] = false;

    const QSize sz = d->device->size();
    d->width = sz.width();
    d->height = sz.height();
    d->mode = BrushDrawingMode;
    d->brushTextureDirty = true;
    d->brushUniformsDirty = true;
    d->matrixUniformDirty = true;
    d->matrixDirty = true;
    d->compositionModeDirty = true;
    d->opacityUniformDirty = true;
    d->needsSync = true;
    d->useSystemClip = !systemClip().isEmpty();
    d->currentBrush = QBrush();

    d->dirtyStencilRegion = QRect(0, 0, d->width, d->height);
    d->stencilClean = true;

    d->shaderManager = new QOpenGLEngineShaderManager(d->ctx);

    d->funcs.glDisable(GL_STENCIL_TEST);
    d->funcs.glDisable(GL_DEPTH_TEST);
    d->funcs.glDisable(GL_SCISSOR_TEST);

    d->glyphCacheFormat = QFontEngine::Format_A8;

#if !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        d->funcs.glDisable(GL_MULTISAMPLE);
        d->glyphCacheFormat = QFontEngine::Format_A32;
        d->multisamplingAlwaysEnabled = false;
    } else
#endif // !QT_CONFIG(opengles2)
    {
        // OpenGL ES can't switch MSAA off, so if the gl paint device is
        // multisampled, it's always multisampled.
        d->multisamplingAlwaysEnabled = d->device->context()->format().samples() > 1;
    }

    return true;
}